

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O2

void __thiscall Game::buyCardsComputer(Game *this,Player *player)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  Cards card;
  vector<Cards,_std::allocator<Cards>_> local_1f8;
  Cards local_1e0;
  Cards local_170;
  Cards local_100;
  Cards local_90;
  
  DeckOfCards::topThreeCards(&local_1f8,&this->deckOfCards);
  if (local_1f8.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_1f8.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    Cards::Cards(&local_1e0,
                 local_1f8.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
                 super__Vector_impl_data._M_start);
    iVar1 = Cards::getEnergyCost(&local_1e0);
    iVar2 = Player::getEnergyCubes(player);
    if (iVar1 < iVar2) {
      Cards::Cards(&local_100,&local_1e0);
      DeckOfCards::draw(&local_90,&this->deckOfCards,&local_100);
      Cards::~Cards(&local_90);
      Cards::~Cards(&local_100);
      Cards::Cards(&local_170,&local_1e0);
      Player::buyCards(player,&local_170);
      Cards::~Cards(&local_170);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Cannot afford any cards");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    Cards::~Cards(&local_1e0);
  }
  std::vector<Cards,_std::allocator<Cards>_>::~vector(&local_1f8);
  return;
}

Assistant:

void Game::buyCardsComputer(Player* player) {
    for(Cards card: deckOfCards.topThreeCards()) {
        if(card.getEnergyCost() < player->getEnergyCubes()){
            deckOfCards.draw(card);
            player->buyCards(card);
            return;
        }
        else{
            cout << "Cannot afford any cards" << endl;
            return;
        }
    }
}